

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,unsigned_char,double,double>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x78);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01095c80;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1FwdTxfm2d_RunFwdAccuracyCheck_Test_01095cc0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }